

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

void idx(item *x,item *y)

{
  int iVar1;
  typeDesc *ptVar2;
  char *msg;
  
  if (y->typeIndex != intTypeIndex) {
    msg = "index not an integer";
LAB_00106f63:
    mark(msg);
    exit(-1);
  }
  ptVar2 = getType(x->typeIndex);
  iVar1 = y->mode;
  if (x->alr == 0) {
    if (iVar1 != 0x2c2) {
      if (iVar1 == 0x2bd) {
        iVar1 = y->a;
        if ((iVar1 < 0) || (ptVar2->len <= iVar1)) {
          msg = "index out of range";
          goto LAB_00106f63;
        }
        x->a = x->a + iVar1 * ptVar2->base->size;
        goto LAB_00106f48;
      }
      load(y);
    }
    put(0x1e,y->r,0,ptVar2->len);
    put(0x12,y->r,y->r,ptVar2->base->size);
    if (x->r != 0) {
      put(0,y->r,x->r,y->r);
      regs[x->r] = 0;
    }
    x->r = y->r;
    goto LAB_00106f48;
  }
  if (iVar1 == 0x2c2) {
LAB_00106e7d:
    put(0xe,y->r,0,x->alr);
    put(0x12,y->r,y->r,ptVar2->base->size);
    if (x->r != 0) {
      put(0,y->r,x->r,y->r);
      regs[x->r] = 0;
    }
    x->r = y->r;
  }
  else {
    if (iVar1 != 0x2bd) {
      load(y);
      goto LAB_00106e7d;
    }
    iVar1 = getReg();
    put(0x10,iVar1,0,y->a);
    put(0xe,iVar1,0,x->alr);
    put(0x12,iVar1,iVar1,ptVar2->base->size);
    if (x->r != 0) {
      put(0,iVar1,x->r,iVar1);
      regs[x->r] = 0;
    }
    x->r = iVar1;
  }
  regs[x->alr] = 0;
LAB_00106f48:
  x->typeIndex = ptVar2->base->index;
  return;
}

Assistant:

procedure 
void idx(struct item *x, struct item *y) {
	variable int r;
	variable struct typeDesc *type;
	type=NULL; r = 0;
	if (y->typeIndex != intTypeIndex) {
		mark("index not an integer");
		exit(-1);
	}
	type = getType(x->typeIndex);

	 /* array is given as parameter */
	if (x->alr != 0) {
		if (y->mode == CLASS_CONST) {
			r = getReg();
			put(RISC_ADDI,r,0,y->a); 
			put(RISC_CHK,r,0,x->alr); 

			put(RISC_MULI,r,r,type->base->size);
			if (x->r != 0) { 
			
				/* R[r] := FP/global + R[r] */
				put(RISC_ADD,r,x->r,r); 
				regs[x->r] = 0;
			}
			x->r = r;
			regs[x->alr] = 0;
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			put(RISC_CHK,y->r,0,x->alr);
			put(RISC_MULI,y->r,y->r,type->base->size);
			if (x->r != 0) {
				put(RISC_ADD,y->r,x->r,y->r);
				regs[x->r] = 0;
			}
			x->r = y->r;
			regs[x->alr] = 0;
		}
	} else {
		if (y->mode == CLASS_CONST) {
			if ((y->a < 0) || (y->a >= type->len)) {
				mark("index out of range");
				exit(-1);
			}
			x->a = x->a + y->a * type->base->size; /* fix */
		} else {
			if (y->mode != CLASS_REG) {
				load(y);
			}
			put(RISC_CHKI,y->r,0,type->len);
			put(RISC_MULI,y->r,y->r,type->base->size);
			if (x->r != 0) {
				put(RISC_ADD,y->r,x->r,y->r);
				regs[x->r] = 0;
			}
			x->r = y->r;
		}
	}
	x->typeIndex = type->base->index;
}